

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# by_file.cc
# Opt level: O2

int X509_load_cert_file(X509_LOOKUP *ctx,char *file,int type)

{
  int line;
  int iVar1;
  BIO_METHOD *type_00;
  BIO *bp;
  X509 *x;
  ulong uVar2;
  int iVar3;
  
  type_00 = BIO_s_file();
  bp = BIO_new(type_00);
  if (bp == (BIO *)0x0) {
LAB_00221204:
    iVar1 = 2;
    line = 0x42;
LAB_00221216:
    iVar3 = 0;
    ERR_put_error(0xb,0,iVar1,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/by_file.cc"
                  ,line);
  }
  else {
    iVar1 = BIO_read_filename((BIO *)bp,file);
    if (iVar1 < 1) goto LAB_00221204;
    if (type == 2) {
      x = d2i_X509_bio(bp,(X509 **)0x0);
      if (x != (X509 *)0x0) {
        iVar3 = X509_STORE_add_cert((X509_STORE *)ctx->method_data,x);
        goto LAB_00221222;
      }
      iVar1 = 0xc;
      line = 0x5f;
      goto LAB_00221216;
    }
    if (type != 1) {
      iVar1 = 0x66;
      line = 0x68;
      goto LAB_00221216;
    }
    iVar3 = 0;
    while( true ) {
      x = PEM_read_bio_X509_AUX(bp,(X509 **)0x0,(undefined1 *)0x0,(void *)0x0);
      if (x == (X509 *)0x0) break;
      iVar1 = X509_STORE_add_cert((X509_STORE *)ctx->method_data,x);
      if (iVar1 == 0) {
        iVar3 = 0;
        goto LAB_00221222;
      }
      iVar3 = iVar3 + 1;
      X509_free(x);
    }
    uVar2 = ERR_peek_last_error();
    if ((((uint)uVar2 & 0xff000000) != 0x9000000) || (iVar3 == 0 || ((uint)uVar2 & 0xfff) != 0x6e))
    {
      iVar1 = 9;
      line = 0x50;
      goto LAB_00221216;
    }
    ERR_clear_error();
  }
  x = (X509 *)0x0;
LAB_00221222:
  X509_free(x);
  BIO_free(bp);
  return iVar3;
}

Assistant:

int X509_load_cert_file(X509_LOOKUP *ctx, const char *file, int type) {
  int ret = 0;
  BIO *in = NULL;
  int i, count = 0;
  X509 *x = NULL;

  in = BIO_new(BIO_s_file());

  if ((in == NULL) || (BIO_read_filename(in, file) <= 0)) {
    OPENSSL_PUT_ERROR(X509, ERR_R_SYS_LIB);
    goto err;
  }

  if (type == X509_FILETYPE_PEM) {
    for (;;) {
      x = PEM_read_bio_X509_AUX(in, NULL, NULL, NULL);
      if (x == NULL) {
        uint32_t error = ERR_peek_last_error();
        if (ERR_GET_LIB(error) == ERR_LIB_PEM &&
            ERR_GET_REASON(error) == PEM_R_NO_START_LINE && count > 0) {
          ERR_clear_error();
          break;
        }
        OPENSSL_PUT_ERROR(X509, ERR_R_PEM_LIB);
        goto err;
      }
      i = X509_STORE_add_cert(ctx->store_ctx, x);
      if (!i) {
        goto err;
      }
      count++;
      X509_free(x);
      x = NULL;
    }
    ret = count;
  } else if (type == X509_FILETYPE_ASN1) {
    x = d2i_X509_bio(in, NULL);
    if (x == NULL) {
      OPENSSL_PUT_ERROR(X509, ERR_R_ASN1_LIB);
      goto err;
    }
    i = X509_STORE_add_cert(ctx->store_ctx, x);
    if (!i) {
      goto err;
    }
    ret = i;
  } else {
    OPENSSL_PUT_ERROR(X509, X509_R_BAD_X509_FILETYPE);
    goto err;
  }

  if (ret == 0) {
    OPENSSL_PUT_ERROR(X509, X509_R_NO_CERTIFICATE_FOUND);
  }

err:
  X509_free(x);
  BIO_free(in);
  return ret;
}